

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleMainExtended.cpp
# Opt level: O1

int main(int argvs,char **argv)

{
  char **argv_00;
  bool bVar1;
  argvParser *this;
  argParserAdvancedConfiguration *paVar2;
  function<int_(int,_char_**)> lambdaCallback;
  _Any_data local_4c8;
  code *local_4b8;
  code *local_4b0;
  char **local_4a0;
  _Any_data local_498;
  code *local_488;
  _Any_data local_478;
  code *local_468;
  code *local_460;
  _Any_data local_458;
  code *local_448;
  code *local_440;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this = (argvParser *)operator_new(0x130);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Extendend Example","");
  local_4a0 = argv;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"This application intends to be an example ","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  argvParser::argvParser(this,&local_50,&local_70,true,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"-t","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"--test","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"test argument","");
  local_458._M_unused._M_object = (void *)0x0;
  local_458._8_8_ = 0;
  local_440 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/exampleMainExtended.cpp:50:48)>
              ::_M_invoke;
  local_448 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/exampleMainExtended.cpp:50:48)>
              ::_M_manager;
  paVar2 = argvParser::addArg(this,&local_b0,&local_d0,&local_f0,(function<void_()> *)&local_458);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,
             "It is possible to add addition information for one command. Now the user can ype <-h -t> and see this additional information"
             ,"");
  argParserAdvancedConfiguration::addAdditionalHelp(paVar2,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_448 != (code *)0x0) {
    (*local_448)(&local_458,&local_458,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_4c8._M_unused._M_object = (void *)0x0;
  local_4c8._8_8_ = 0;
  local_4b0 = std::
              _Function_handler<int_(int,_char_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/exampleMainExtended.cpp:53:50)>
              ::_M_invoke;
  local_4b8 = std::
              _Function_handler<int_(int,_char_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/exampleMainExtended.cpp:53:50)>
              ::_M_manager;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"-f","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"--foo","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,"foo test argument  required argument example","");
  std::function<int_(int,_char_**)>::function
            ((function<int_(int,_char_**)> *)&local_498,(function<int_(int,_char_**)> *)&local_4c8);
  paVar2 = argvParser::addArg(this,&local_130,&local_150,&local_170,
                              (function<int_(int,_char_**)> *)&local_498);
  paVar2 = argParserAdvancedConfiguration::required(paVar2);
  paVar2 = argParserAdvancedConfiguration::numberOfParameter(paVar2,1);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"prints the next element to the cli","");
  argParserAdvancedConfiguration::addAdditionalHelp(paVar2,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if (local_488 != (code *)0x0) {
    (*local_488)(&local_498,&local_498,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"-p","");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"--print","");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"echo text","");
  paVar2 = argvParser::addArg(this,&local_1b0,&local_1d0,&local_1f0,printCallBack);
  paVar2 = argParserAdvancedConfiguration::numberOfParameter(paVar2,1);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"echo the next argument","");
  argParserAdvancedConfiguration::addAdditionalHelp(paVar2,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"-e","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"--enums","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"enum example","");
  paVar2 = argvParser::addArg(this,&local_230,&local_250,&local_270,enumCallBack);
  paVar2 = argParserAdvancedConfiguration::numberOfParameter(paVar2,1);
  paVar2 = argParserAdvancedConfiguration::allowedParameter(paVar2,3,"abc","def","xyz");
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,"here is just a pre defined set of arguments allowed","");
  argParserAdvancedConfiguration::addAdditionalHelp(paVar2,&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"-o","");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"--open","");
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f0,"example to complete a file/dir","");
  paVar2 = argvParser::addArg(this,&local_2b0,&local_2d0,&local_2f0,printCallBack);
  paVar2 = argParserAdvancedConfiguration::numberOfParameter(paVar2,1);
  argParserAdvancedConfiguration::asFile(paVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-nh","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"--noHighlight","");
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_350,"disabledCli highlighting","");
  local_478._M_unused._M_object = (void *)0x0;
  local_478._8_8_ = 0;
  local_460 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/exampleMainExtended.cpp:70:67)>
              ::_M_invoke;
  local_468 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/exampleMainExtended.cpp:70:67)>
              ::_M_manager;
  argvParser::addArg(this,&local_310,&local_330,&local_350,(function<void_()> *)&local_478);
  if (local_468 != (code *)0x0) {
    (*local_468)(&local_478,&local_478,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"logging","");
  argvParser::addSection(this,&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"-l","");
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"--logging","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"enable logging","");
  argvParser::addArg(this,&local_390,&local_3b0,&local_3d0,loggingCallBack);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"-logf","");
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"--logFile","");
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"generate logfile","");
  argvParser::addArg(this,&local_3f0,&local_410,&local_430,logFileCallBack);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  argv_00 = local_4a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  bVar1 = argvParser::analyseArgv(this,argvs,argv_00);
  if (!bVar1) {
    argvParser::printHelpMessage(this,(bool)(disableCliH ^ 1));
    bVar1 = argvParser::foundAllRequierdArgs(this);
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "you have not entered at least one required argument  \n\t -f has been marked as an required argument try it with -f"
                 ,0x71);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
    }
  }
  if (local_4b8 != (code *)0x0) {
    (*local_4b8)(&local_4c8,&local_4c8,__destroy_functor);
  }
  return 0;
}

Assistant:

int main(int argvs, char **argv) {
    // define program description
    argvParser *p = new argvParser("Extendend Example","This application intends to be an example ");
    // define program arguments
    // Simple Lambda CallBack
    p->addArg("-t", "--test", "test argument", []() { cout << "got \"test\"" << endl; })
    ->addAdditionalHelp("It is possible to add addition information for one command. Now the user can ype <-h -t> and see this additional information"); // no further arguments used);
    // Lambda CallBack as required and one additional parameter
    function<int(int, char **)> lambdaCallback = [](int index, char **buff) {
        index++;
        cout << "got \"foo\" with : " << buff[index] << endl;
        return index;
    };
    p->addArg("-f", "--foo", "foo test argument  required argument example",
              lambdaCallback)->required()->numberOfParameter(1)->addAdditionalHelp("prints the next element to the cli");
    // Function as Callback
    p->addArg("-p", "--print", "echo text", printCallBack)->numberOfParameter(1)->addAdditionalHelp(
            "echo the next argument");
    // pre defined parameter for "-e"  with bash autocompletion
    p->addArg("-e", "--enums", "enum example", enumCallBack)->numberOfParameter(1)->allowedParameter(3, "abc", "def",
                                                                                                     "xyz")
            ->addAdditionalHelp("here is just a pre defined set of arguments allowed");
    // autocompletion with filenames
    p->addArg("-o", "--open", "example to complete a file/dir", printCallBack)->numberOfParameter(1)->asFile();
    // lambda
    p->addArg("-nh", "--noHighlight", "disabledCli highlighting", [] { disableCliH = false; });
    p->addSection("logging");
    p->addArg("-l", "--logging", "enable logging", loggingCallBack);
    p->addArg("-logf", "--logFile", "generate logfile", logFileCallBack);

    // check if all arguments are valid
    if (!p->analyseArgv(argvs, argv)) {
        p->printHelpMessage(!disableCliH);
        // check if all required arguments have been parsed
        if (!p->foundAllRequierdArgs()) {
            cout
                    << "you have not entered at least one required argument  \n\t -f has been marked as an required argument try it with -f"
                    << endl;
        }
    }

    return 0;
}